

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int vocgobj(voccxdef *ctx,char **cmd,int *typelist,int cur,int *next,int complain,vocoldef *nounlist
           ,int multi,int chkact,int *no_match)

{
  uchar *puVar1;
  int iVar2;
  void *pvVar3;
  long in_RSI;
  voccxdef *in_RDI;
  int *in_R8;
  int in_R9D;
  bool bVar4;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  uchar *save_sp;
  vocoldef *tmplist;
  int lastcur;
  int again;
  int i;
  int outcnt;
  int cnt;
  int *in_stack_00000070;
  char **in_stack_00000078;
  vocoldef *in_stack_000000a0;
  int in_stack_000000a8;
  int *in_stack_000000b0;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_48;
  int local_40;
  int local_3c;
  int local_34;
  int local_24;
  
  local_3c = 0;
  bVar4 = false;
  puVar1 = in_RDI->voc_stk_cur;
  pvVar3 = voc_stk_alo((voccxdef *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  local_34 = in_R9D;
  while( true ) {
    iVar2 = vocg1o((voccxdef *)nounlist,in_stack_00000078,in_stack_00000070,ctx._4_4_,(int *)cmd,
                   typelist._4_4_,in_stack_000000a0,in_stack_000000a8,in_stack_000000b0);
    if (iVar2 < 0) {
      in_RDI->voc_stk_cur = puVar1;
      return iVar2;
    }
    if (0 < iVar2) {
      for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
        memcpy((void *)(in_stack_00000008 + (long)local_3c * 0x28),
               (void *)((long)pvVar3 + (long)local_40 * 0x28),0x28);
        local_3c = local_3c + 1;
        if (200 < local_3c) {
          vocerr(in_RDI,0xb,"You\'re referring to too many objects.");
          in_RDI->voc_stk_cur = puVar1;
          return -1;
        }
      }
    }
    if (iVar2 == 0) break;
    if ((((in_stack_00000010 == 0) || (in_stack_00000018 != 0)) ||
        (local_48 = *in_R8, local_48 == -1)) ||
       ((*(long *)(in_RSI + (long)local_48 * 8) == 0 ||
        (local_24 = local_48, **(char **)(in_RSI + (long)local_48 * 8) != ',')))) goto LAB_00238087;
    while( true ) {
      bVar4 = false;
      if (*(long *)(in_RSI + (long)local_24 * 8) != 0) {
        bVar4 = **(char **)(in_RSI + (long)local_24 * 8) == ',';
      }
      if (!bVar4) break;
      local_24 = local_24 + 1;
    }
    bVar4 = true;
    if (local_34 != 0) {
      local_34 = 2;
    }
  }
  if (bVar4) {
    *in_R8 = local_48;
  }
LAB_00238087:
  *(undefined2 *)(in_stack_00000008 + (long)local_3c * 0x28) = 0xffff;
  *(undefined4 *)(in_stack_00000008 + (long)local_3c * 0x28 + 0x20) = 0;
  in_RDI->voc_stk_cur = puVar1;
  return local_3c;
}

Assistant:

int vocgobj(voccxdef *ctx, char *cmd[], int typelist[],
            int cur, int *next, int complain, vocoldef *nounlist,
            int multi, int chkact, int *no_match)
{
    int       cnt;
    int       outcnt = 0;
    int       i;
    int       again = FALSE;
    int       lastcur;
    vocoldef *tmplist;
    uchar    *save_sp;

    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, tmplist);

    for ( ;; )
    {
        /* try getting a single object */
        cnt = vocg1o(ctx, cmd, typelist, cur, next, complain,
                     tmplist, chkact, no_match);

        /* if we encountered a syntax error, return failure */
        if (cnt < 0)
        {
            VOC_RETVAL(ctx, save_sp, cnt);
        }

        /* if we got any objects, store them in our output list */
        if (cnt > 0)
        {
            for (i = 0 ; i < cnt ; ++i)
            {
                OSCPYSTRUCT(nounlist[outcnt], tmplist[i]);
                if (++outcnt > VOCMAXAMBIG)
                {
                    vocerr(ctx, VOCERR(11),
                           "You're referring to too many objects.");
                    VOC_RETVAL(ctx, save_sp, -1);
                }
            }
        }

        /* if we didn't find any objects, stop looking */
        if (cnt == 0)
        {
            if (again)
                *next = lastcur;
            break;
        }

        /* 
         *   if the caller only wanted a single object (or is getting an
         *   actor, in which case they implicitly want only a single
         *   object), stop looking for additional noun phrases 
         */
        if (!multi || chkact)
            break;

        /* skip past the previous noun phrase */
        cur = *next;

        /* 
         *   if we're looking at a noun phrase separator ("and" or a
         *   comma), get the next noun phrase; otherwise, we're done 
         */
        if (cur != -1 && cmd[cur] != 0 && vocspec(cmd[cur], VOCW_AND))
        {
            lastcur = cur;
            while (cmd[cur] && vocspec(cmd[cur], VOCW_AND)) ++cur;
            again = TRUE;
            if (complain) complain = 2;
        }
        else
        {
            /* end of line, or not at a separator - we're done */
            break;
        }
    }

    /* terminate the list and return the number of objects we found */
    nounlist[outcnt].vocolobj = MCMONINV;
    nounlist[outcnt].vocolflg = 0;
    VOC_RETVAL(ctx, save_sp, outcnt);
}